

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shm_writer.cpp
# Opt level: O1

void __thiscall diffusion::ShmWriter::ShmWriter(ShmWriter *this,string *shm_name,Size shm_size)

{
  unique_ptr<boost::interprocess::mapped_region,_std::default_delete<boost::interprocess::mapped_region>_>
  *this_00;
  pointer pcVar1;
  _Head_base<0UL,_boost::interprocess::mapped_region_*,_false> __ptr_00;
  mapped_region *pmVar2;
  char *pcVar3;
  int iVar4;
  _Head_base<0UL,_boost::interprocess::mapped_region_*,_false> this_01;
  int *piVar5;
  interprocess_exception *this_02;
  long lVar6;
  pointer __p;
  pointer *__ptr;
  error_info local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  (this->super_Writer)._vptr_Writer = (_func_int **)&PTR_write_00108d10;
  local_38 = &(this->shm_name_).field_2;
  (this->shm_name_)._M_dataplus._M_p = (pointer)local_38;
  pcVar1 = (shm_name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->shm_name_,pcVar1,pcVar1 + shm_name->_M_string_length);
  local_40.m_nat = 0x1a4;
  boost::interprocess::shared_memory_object::shared_memory_object
            (&this->shm_object_,(shm_name->_M_dataplus)._M_p,2);
  this_00 = &this->shm_region_;
  (this->shm_region_)._M_t.
  super___uniq_ptr_impl<boost::interprocess::mapped_region,_std::default_delete<boost::interprocess::mapped_region>_>
  ._M_t.
  super__Tuple_impl<0UL,_boost::interprocess::mapped_region_*,_std::default_delete<boost::interprocess::mapped_region>_>
  .super__Head_base<0UL,_boost::interprocess::mapped_region_*,_false>._M_head_impl =
       (mapped_region *)0x0;
  this->writer_shm_body_offset_ = 0;
  iVar4 = ftruncate((this->shm_object_).m_handle,(long)shm_size);
  if (iVar4 == 0) {
    this_01._M_head_impl = (mapped_region *)operator_new(0x20);
    boost::interprocess::mapped_region::mapped_region<boost::interprocess::shared_memory_object>
              (this_01._M_head_impl,&this->shm_object_,read_write,0,0,(void *)0x0,-1);
    local_40.m_nat = 0;
    local_40.m_ec = no_error;
    __ptr_00._M_head_impl =
         (this_00->_M_t).
         super___uniq_ptr_impl<boost::interprocess::mapped_region,_std::default_delete<boost::interprocess::mapped_region>_>
         ._M_t.
         super__Tuple_impl<0UL,_boost::interprocess::mapped_region_*,_std::default_delete<boost::interprocess::mapped_region>_>
         .super__Head_base<0UL,_boost::interprocess::mapped_region_*,_false>._M_head_impl;
    (this_00->_M_t).
    super___uniq_ptr_impl<boost::interprocess::mapped_region,_std::default_delete<boost::interprocess::mapped_region>_>
    ._M_t.
    super__Tuple_impl<0UL,_boost::interprocess::mapped_region_*,_std::default_delete<boost::interprocess::mapped_region>_>
    .super__Head_base<0UL,_boost::interprocess::mapped_region_*,_false>._M_head_impl =
         this_01._M_head_impl;
    if (__ptr_00._M_head_impl != (mapped_region *)0x0) {
      std::default_delete<boost::interprocess::mapped_region>::operator()
                ((default_delete<boost::interprocess::mapped_region> *)this_00,__ptr_00._M_head_impl
                );
    }
    if (local_40 != (error_info)0x0) {
      std::default_delete<boost::interprocess::mapped_region>::operator()
                ((default_delete<boost::interprocess::mapped_region> *)&local_40,
                 (mapped_region *)local_40);
    }
    pmVar2 = (this->shm_region_)._M_t.
             super___uniq_ptr_impl<boost::interprocess::mapped_region,_std::default_delete<boost::interprocess::mapped_region>_>
             ._M_t.
             super__Tuple_impl<0UL,_boost::interprocess::mapped_region_*,_std::default_delete<boost::interprocess::mapped_region>_>
             .super__Head_base<0UL,_boost::interprocess::mapped_region_*,_false>._M_head_impl;
    pcVar3 = (char *)pmVar2->m_base;
    this->shm_header_position_ = pcVar3;
    this->shm_body_position_ = pcVar3 + 8;
    this->shm_body_size_ = (int)pmVar2->m_size + -8;
    return;
  }
  piVar5 = __errno_location();
  lVar6 = 0;
  do {
    if (*(int *)((long)&boost::interprocess::ec_table + lVar6) == *piVar5) {
      local_40.m_ec = *(error_code_t *)(&UNK_00106164 + lVar6);
      goto LAB_00104c64;
    }
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x80);
  local_40.m_ec = system_error;
LAB_00104c64:
  local_40.m_nat = *piVar5;
  this_02 = (interprocess_exception *)__cxa_allocate_exception(0x30);
  boost::interprocess::interprocess_exception::interprocess_exception(this_02,&local_40,(char *)0x0)
  ;
  __cxa_throw(this_02,&boost::interprocess::interprocess_exception::typeinfo,
              boost::interprocess::interprocess_exception::~interprocess_exception);
}

Assistant:

ShmWriter::ShmWriter(std::string const & shm_name, Size shm_size)
    : shm_name_(shm_name),
      shm_object_(boost::interprocess::create_only, shm_name.c_str(), boost::interprocess::read_write),
      writer_shm_body_offset_(0) {
    shm_object_.truncate(shm_size);
    shm_region_ = std::unique_ptr<boost::interprocess::mapped_region>(new boost::interprocess::mapped_region(shm_object_, boost::interprocess::read_write));
    shm_header_position_ = reinterpret_cast<char *>(shm_region_->get_address());
    shm_body_position_ = shm_header_position_ + kShmHeaderLength;
    shm_body_size_ = shm_region_->get_size() - kShmHeaderLength;
}